

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_link_32(m68k_info *info)

{
  uint disp;
  
  if ((info->type & 0x1c) != 0) {
    disp = read_imm_32(info);
    build_link(info,disp,4);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_link_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_link(info, read_imm_32(info), 4);
}